

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.h
# Opt level: O0

void __thiscall soplex::MPSInput::syntaxError(MPSInput *this)

{
  ostream *this_00;
  void *this_01;
  long in_RDI;
  
  this_00 = std::operator<<((ostream *)&std::cerr,"Syntax error in line ");
  this_01 = (void *)std::ostream::operator<<(this_00,*(int *)(in_RDI + 0x18));
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  *(undefined4 *)(in_RDI + 8) = 8;
  *(undefined1 *)(in_RDI + 0x20) = 1;
  return;
}

Assistant:

void syntaxError()
   {
      SPX_MSG_ERROR(std::cerr << "Syntax error in line " << m_lineno << std::endl;)
      m_section = ENDATA;
      m_has_error = true;
   }